

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O2

int __thiscall
CRegexSearcher::search
          (CRegexSearcher *this,char *entirestr,char *str,size_t len,
          re_compiled_pattern_base *pattern,re_tuple_conflict *tuple_arr,re_machine *machine,
          re_group_register_conflict *regs,int *result_len)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  int iVar5;
  re_group_register_conflict *prVar6;
  re_group_register_conflict *prVar7;
  ulong uVar8;
  int iVar9;
  byte bVar10;
  utf8_ptr local_f0;
  char *local_e8;
  size_t len_local;
  char *local_d8;
  CRegexSearcher *local_d0;
  char *local_c8;
  re_tuple_conflict *local_c0;
  short loop_vars [20];
  re_group_register_conflict best_match_regs [10];
  
  bVar10 = 0;
  pcVar4 = str + len;
  local_d8 = str + (len - (long)entirestr);
  iVar9 = -1;
  uVar8 = 0xffffffff;
  local_f0.p_ = str;
  local_e8 = str;
  len_local = len;
  local_d0 = this;
  local_c8 = entirestr;
  local_c0 = tuple_arr;
  do {
    uVar1 = match(local_d0,local_c8,(size_t)local_d8,local_f0.p_,len_local,pattern,local_c0,machine,
                  regs,loop_vars);
    if (-1 < (int)uVar1) {
      if ((pattern->field_0x14 & 8) != 0) {
        *result_len = uVar1;
        return (int)local_f0.p_ - (int)local_e8;
      }
      if ((int)uVar8 != -1) {
        iVar3 = uVar1 + ((int)local_f0.p_ - (int)local_e8);
        iVar5 = iVar9 + (int)uVar8;
        if ((iVar5 <= iVar3) && (((pattern->field_0x14 & 4) != 0 || (iVar3 != iVar5))))
        goto LAB_0029fb89;
      }
      prVar6 = regs;
      prVar7 = best_match_regs;
      for (lVar2 = 0x14; lVar2 != 0; lVar2 = lVar2 + -1) {
        prVar7->start_ofs = prVar6->start_ofs;
        prVar6 = (re_group_register_conflict *)&prVar6[-(ulong)bVar10].end_ofs;
        prVar7 = (re_group_register_conflict *)&prVar7[-(ulong)bVar10].end_ofs;
      }
      pcVar4 = local_f0.p_ + uVar1;
      uVar8 = (ulong)uVar1;
      iVar9 = (int)local_f0.p_ - (int)local_e8;
    }
LAB_0029fb89:
    if (local_f0.p_ == pcVar4) {
      if ((int)uVar8 == -1) {
        iVar9 = -1;
      }
      else {
        *result_len = (int)uVar8;
        prVar6 = best_match_regs;
        for (lVar2 = 0x14; lVar2 != 0; lVar2 = lVar2 + -1) {
          regs->start_ofs = prVar6->start_ofs;
          prVar6 = (re_group_register_conflict *)&prVar6[-(ulong)bVar10].end_ofs;
          regs = (re_group_register_conflict *)&regs[-(ulong)bVar10].end_ofs;
        }
      }
      return iVar9;
    }
    utf8_ptr::inc(&local_f0,&len_local);
  } while( true );
}

Assistant:

int CRegexSearcher::search(const char *entirestr, const char *str, size_t len,
                           const re_compiled_pattern_base *pattern,
                           const re_tuple *tuple_arr,
                           const re_machine *machine, re_group_register *regs,
                           int *result_len)
{
    re_group_register best_match_regs[RE_GROUP_REG_CNT];
    short loop_vars[RE_LOOP_VARS_MAX];

    /* we don't have a match yet */
    int best_match_len = -1;
    int best_match_start = -1;

    /* search the entire string */
    const char *max_start_pos = str + len;

    /* figure the length of the overall string */
    size_t entirelen = len + (str - entirestr);
    
    /*
     *   Starting at the first character in the string, search for the
     *   pattern at each subsequent character until we either find the
     *   pattern or run out of string to test. 
     */
    utf8_ptr p;
    for (p.set((char *)str) ; ; )
    {
        /* check for a match */
        int matchlen = match(entirestr, entirelen, p.getptr(), len,
                             pattern, tuple_arr, machine, regs, loop_vars);
        if (matchlen >= 0)
        {
            /* check our first-begin/first-end mode */
            if (pattern->first_begin)
            {
                /*   
                 *   We're in first-begin mode: return immediately,
                 *   because we want to find the match that starts at the
                 *   earliest point in the string; having found a match
                 *   here, there's no point in looking for a later match,
                 *   since it obviously won't start any earlier than this
                 *   one does.  
                 */
                *result_len = matchlen;
                return p.getptr() - str;
            }
            else
            {
                int keep;
                
                /*
                 *   We're in first-end mode.  We can't return yet,
                 *   because we might find something that ends before this
                 *   string does.
                 *   
                 *   If this is the first or best match so far, note it;
                 *   otherwise, ignore it.  In any case, continue looking.
                 */
                if (best_match_len == -1)
                {
                    /* 
                     *   this is our first match - it's definitely the
                     *   best so far 
                     */
                    keep = TRUE;
                }
                else
                {
                    /* calculate the ending index of this match */
                    int end_idx = (p.getptr() - str) + matchlen;

                    /* see what we have */
                    if (end_idx < best_match_start + best_match_len)
                    {
                        /* 
                         *   this one ends earlier than the previous best
                         *   match so far -- we definitely want to keep
                         *   this one 
                         */
                        keep = TRUE;
                    }
                    else if (end_idx == best_match_start + best_match_len)
                    {
                        /* 
                         *   This one ends at exactly the same point as
                         *   our best match so far.  Decide which one to
                         *   keep based on the lengths.  If we're in
                         *   longest-match mode, keep the longer one,
                         *   otherwise keep the shorter one. 
                         */
                        if (pattern->longest_match)
                        {
                            /* 
                             *   longest-match mode - keep the old one,
                             *   since it's longer (it starts earlier and
                             *   ends at the same point) 
                             */
                            keep = FALSE;
                        }
                        else
                        {
                            /* 
                             *   shortest-match mode - keep the new one,
                             *   since it's shorter (it starts later and
                             *   ends at the same point) 
                             */
                            keep = TRUE;
                        }
                    }
                    else
                    {
                        /* 
                         *   this one isn't as good as the previous best
                         *   -- ignore this one and keep our previous
                         *   winner 
                         */
                        keep = FALSE;
                    }
                }
                
                /* if we're keeping this match, save it */
                if (keep)
                {
                    /* save the start index, length, and register contents */
                    best_match_start = p.getptr() - str;
                    best_match_len = matchlen;
                    memcpy(best_match_regs, regs, sizeof(best_match_regs));

                    /*
                     *   There's no point in looking for strings that
                     *   start beyond the end of the current match,
                     *   because they certainly won't end before this
                     *   match ends.  So, adjust our end-of-loop marker to
                     *   point to the next character past the end of our
                     *   match. 
                     */
                    max_start_pos = p.getptr() + matchlen;
                }
            }
		}

		/* stop if we've reached the end of the string */
		if (p.getptr() == max_start_pos)
			break;

		/* advance by one character and try again */
		p.inc(&len);
	}

    /* if we found a previous match, return it */
    if (best_match_len != -1)
    {
        /* set the caller's match length */
        *result_len = best_match_len;

        /* copy the saved match registers into the caller's registers */
        memcpy(regs, best_match_regs, sizeof(best_match_regs));

        /* return the starting index of the match */
        return best_match_start;
    }

    /* we didn't find a match */
    return -1;
}